

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::zesDriverGetDeviceByUuidExp
          (validation_layer *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,
          zes_device_handle_t *phDevice,ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  zes_uuid_t uuid_00;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  zes_device_handle_t *phDevice_00;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  bool bVar11;
  ze_result_t local_a4;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar3 = context;
  phDevice_00 = uuid.id._8_8_;
  uVar7 = uuid.id._0_8_;
  lVar6 = *(long *)(context + 0xd50);
  plVar10 = local_58;
  local_68[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != plVar10) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(lVar3 + 0x9f8);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd30);
    lVar3 = *(long *)(lVar3 + 0xd38);
    uVar8 = lVar3 - lVar6 >> 3;
    bVar11 = lVar3 != lVar6;
    if (bVar11) {
      uVar9 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar9 * 8) + 8);
        zVar5 = (**(code **)(*plVar4 + 0x890))
                          (plVar4,this,hDriver,uVar7,phDevice_00,phDevice,onSubdevice);
        if (zVar5 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesDriverGetDeviceByUuidExp",zVar5);
          plVar10 = (long *)(ulong)zVar5;
          break;
        }
        bVar11 = uVar9 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar9;
        uVar9 = uVar9 + 1;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    local_a4 = (ze_result_t)plVar10;
    if (bVar11) {
      return local_a4;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (uuid_00.id[8] = (char)uVar7, uuid_00.id[9] = (char)((ulong)uVar7 >> 8),
       uuid_00.id[10] = (char)((ulong)uVar7 >> 0x10), uuid_00.id[0xb] = (char)((ulong)uVar7 >> 0x18)
       , uuid_00.id[0xc] = (char)((ulong)uVar7 >> 0x20),
       uuid_00.id[0xd] = (char)((ulong)uVar7 >> 0x28),
       uuid_00.id[0xe] = (char)((ulong)uVar7 >> 0x30),
       uuid_00.id[0xf] = (char)((ulong)uVar7 >> 0x38), uuid_00.id._0_8_ = hDriver,
       zVar5 = ZESHandleLifetimeValidation::zesDriverGetDeviceByUuidExpPrologue
                         ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),
                          (zes_driver_handle_t)this,uuid_00,phDevice_00,(ze_bool_t *)phDevice,
                          (uint32_t *)onSubdevice), zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zesDriverGetDeviceByUuidExp",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(this,hDriver,uVar7,phDevice_00,phDevice,onSubdevice);
    bVar11 = lVar3 != lVar6;
    if (bVar11) {
      uVar9 = 1;
      do {
        plVar10 = *(long **)(*(long *)(*(long *)(lVar1 + 0xd30) + -8 + uVar9 * 8) + 8);
        result = (**(code **)(*plVar10 + 0x898))
                           (plVar10,this,hDriver,uVar7,phDevice_00,phDevice,onSubdevice,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesDriverGetDeviceByUuidExp",result);
          local_a4 = result;
          break;
        }
        bVar11 = uVar9 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar9;
        uVar9 = uVar9 + 1;
      } while (lVar6 != 0);
    }
    if (bVar11) {
      return local_a4;
    }
    if (((zVar5 == ZE_RESULT_SUCCESS) && (phDevice_00 != (zes_device_handle_t *)0x0)) &&
       (*(char *)(lVar1 + 4) != '\0')) {
      HandleLifetimeValidation::addHandle
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phDevice_00);
      HandleLifetimeValidation::addDependent
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),this,*phDevice_00);
    }
  }
  logAndPropagateResult("zesDriverGetDeviceByUuidExp",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        context.logger->log_trace("zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)");

        auto pfnGetDeviceByUuidExp = context.zesDdiTable.DriverExp.pfnGetDeviceByUuidExp;

        if( nullptr == pfnGetDeviceByUuidExp )
            return logAndPropagateResult("zesDriverGetDeviceByUuidExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }

        auto driver_result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpEpilogue( hDriver, uuid, phDevice, onSubdevice, subdeviceId ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phDevice){
                context.handleLifetime->addHandle( *phDevice );
                context.handleLifetime->addDependent( hDriver, *phDevice );

            }
        }
        return logAndPropagateResult("zesDriverGetDeviceByUuidExp", driver_result);
    }